

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElement.h
# Opt level: O2

unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
 __thiscall
ninx::parser::element::ASTElement::clone<ninx::parser::element::FunctionDefinition>
          (ASTElement *this)

{
  undefined8 uVar1;
  _func_int **pp_Var2;
  long *in_RSI;
  
  uVar1 = (**(code **)(*in_RSI + 0x30))();
  pp_Var2 = (_func_int **)__dynamic_cast(uVar1,&typeinfo,&FunctionDefinition::typeinfo,0);
  this->_vptr_ASTElement = pp_Var2;
  (**(code **)(*pp_Var2 + 0x20))(pp_Var2,in_RSI[1]);
  (**(code **)(*pp_Var2 + 0x28))(pp_Var2,in_RSI[2]);
  return (__uniq_ptr_data<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> clone() {
                    std::unique_ptr<T> new_obj(dynamic_cast<T*>(clone_impl()));
                    new_obj->set_parent(this->get_parent());
                    new_obj->__set_output_block(this->__get_output_block());
                    return new_obj;
                }